

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPreservingSwapTests.cpp
# Opt level: O3

int __thiscall
deqp::egl::anon_unknown_0::PreservingSwapTest::init(PreservingSwapTest *this,EVP_PKEY_CTX *ctx)

{
  Functions *dst;
  NativeDisplay *pNVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  Visibility VVar4;
  int iVar5;
  deUint32 dVar6;
  GLuint GVar7;
  GLenum err;
  EGLDisplay pvVar8;
  Library *pLVar9;
  EGLConfig pvVar10;
  NativeWindowFactory *pNVar11;
  undefined4 extraout_var;
  EGLSurface pvVar12;
  undefined4 extraout_var_00;
  GLES2Program *pGVar13;
  pointer pcVar14;
  ReferenceProgram *pRVar15;
  NotSupportedError *this_00;
  long lVar16;
  size_type __dnew;
  size_type __dnew_1;
  EGLint attribList [3];
  value_type local_158;
  value_type local_138;
  Functions *local_118;
  size_type local_110;
  ProgramSources local_108;
  
  pvVar8 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  this->m_eglDisplay = pvVar8;
  pLVar9 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_108.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(CONCAT44((uint)this->m_preserveColorbuffer << 10,0x3033) | 0x400000000);
  local_108.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x400003040;
  local_108.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x3038;
  pvVar10 = eglu::chooseSingleConfig(pLVar9,this->m_eglDisplay,(EGLint *)&local_108);
  this->m_eglConfig = pvVar10;
  if (pvVar10 != (EGLConfig)0x0) {
    pNVar11 = eglu::selectNativeWindowFactory
                        (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine
                        );
    pvVar8 = this->m_eglDisplay;
    pNVar1 = (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
             super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.
             ptr;
    VVar4 = eglu::parseWindowVisibility
                      (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
    local_108.sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1e0000001e0;
    local_108.sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = VVar4;
    iVar5 = (*(pNVar11->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                      (pNVar11,pNVar1,pvVar8,pvVar10,0,&local_108);
    this->m_window = (NativeWindow *)CONCAT44(extraout_var,iVar5);
    pvVar12 = eglu::createWindowSurface
                        ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                         super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                         .m_data.ptr,(NativeWindow *)CONCAT44(extraout_var,iVar5),this->m_eglDisplay
                         ,pvVar10,(EGLAttrib *)0x0);
    this->m_eglSurface = pvVar12;
    pvVar10 = this->m_eglConfig;
    pLVar9 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
    local_108.sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x200003098;
    local_108.sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_108.sources[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,0x3038);
    (**pLVar9->_vptr_Library)(pLVar9,0x30a0);
    iVar5 = (*pLVar9->_vptr_Library[6])(pLVar9,this->m_eglDisplay,pvVar10,0,&local_108);
    this->m_eglContext = (EGLContext)CONCAT44(extraout_var_00,iVar5);
    dVar6 = (*pLVar9->_vptr_Library[0x1f])(pLVar9);
    eglu::checkError(dVar6,"eglCreateContext",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPreservingSwapTests.cpp"
                     ,0x15c);
    (*pLVar9->_vptr_Library[0x27])
              (pLVar9,this->m_eglDisplay,this->m_eglSurface,this->m_eglSurface,this->m_eglContext);
    dVar6 = (*pLVar9->_vptr_Library[0x1f])(pLVar9);
    eglu::checkError(dVar6,"eglMakeCurrent",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPreservingSwapTests.cpp"
                     ,0x160);
    dst = &this->m_gl;
    EglTestContext::initGLFunctions((this->super_TestCase).m_eglTestCtx,dst,(ApiType)0x2);
    pGVar13 = (GLES2Program *)operator_new(0xe0);
    pGVar13->m_gl = dst;
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    local_158._M_dataplus._M_p = (pointer)0x99;
    local_118 = dst;
    pcVar14 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_138,(ulong)&local_158);
    _Var2._M_p = local_158._M_dataplus._M_p;
    local_138.field_2._M_allocated_capacity = (size_type)local_158._M_dataplus._M_p;
    local_138._M_dataplus._M_p = pcVar14;
    memcpy(pcVar14,
           "attribute mediump vec4 a_pos;\nattribute mediump vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main(void)\n{\n\tv_color = a_color;\n\tgl_Position = a_pos;\n}"
           ,0x99);
    local_138._M_string_length = (size_type)_Var2._M_p;
    pcVar14[_Var2._M_p] = '\0';
    local_110 = 0x4a;
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    pcVar14 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_158,(ulong)&local_110);
    sVar3 = local_110;
    local_158.field_2._M_allocated_capacity = local_110;
    local_158._M_dataplus._M_p = pcVar14;
    memcpy(pcVar14,"varying mediump vec4 v_color;\nvoid main(void)\n{\n\tgl_FragColor = v_color;\n}"
           ,0x4a);
    local_158._M_string_length = sVar3;
    pcVar14[sVar3] = '\0';
    memset(&local_108,0,0xac);
    local_108.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_108.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    local_108.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_108._193_8_ = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_108.sources,&local_138);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_108.sources + 1,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,
                      (ulong)(local_138.field_2._M_allocated_capacity + 1));
    }
    glu::ShaderProgram::ShaderProgram(&pGVar13->m_glProgram,local_118,&local_108);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_108.transformFeedbackVaryings);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_108.attribLocationBindings);
    lVar16 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&local_108.sources[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar16));
      lVar16 = lVar16 + -0x18;
    } while (lVar16 != -0x18);
    pGVar13->m_coordLoc = 0xffffffff;
    pGVar13->m_colorLoc = 0xffffffff;
    GVar7 = (*pGVar13->m_gl->getAttribLocation)
                      ((pGVar13->m_glProgram).m_program.m_program,"a_color");
    pGVar13->m_colorLoc = GVar7;
    GVar7 = (*pGVar13->m_gl->getAttribLocation)((pGVar13->m_glProgram).m_program.m_program,"a_pos");
    pGVar13->m_coordLoc = GVar7;
    err = (*pGVar13->m_gl->getError)();
    glu::checkError(err,"Failed to get attribute locations",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPreservingSwapTests.cpp"
                    ,0x99);
    this->m_gles2Program = pGVar13;
    pRVar15 = (ReferenceProgram *)operator_new(1);
    this->m_refProgram = pRVar15;
    return (int)pRVar15;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"No supported config found",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPreservingSwapTests.cpp"
             ,0x169);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void PreservingSwapTest::init (void)
{
	m_eglDisplay	= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_eglConfig		= getEGLConfig(m_eglTestCtx.getLibrary(), m_eglDisplay, m_preserveColorbuffer);

	if (m_eglConfig == DE_NULL)
		TCU_THROW(NotSupportedError, "No supported config found");

	initEGLSurface(m_eglConfig);
	initEGLContext(m_eglConfig);

	m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2,0));

	m_gles2Program	= new GLES2Program(m_gl);
	m_refProgram	= new ReferenceProgram();
}